

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shaderprogram.cpp
# Opt level: O2

void __thiscall FShaderProgram::Link(FShaderProgram *this,char *name)

{
  GLuint GVar1;
  GLint status;
  FShaderProgram local_30;
  GLint local_24;
  
  GVar1 = this->mProgram;
  FString::FString((FString *)&local_30,name);
  FGLDebug::LabelObject(0x82e2,GVar1,(FString *)&local_30);
  FString::~FString((FString *)&local_30);
  (*_ptrc_glLinkProgram)(this->mProgram);
  local_24 = 0;
  GVar1 = 0x8b82;
  (*_ptrc_glGetProgramiv)(this->mProgram,0x8b82,&local_24);
  if (local_24 == 0) {
    GetProgramInfoLog(&local_30,GVar1);
    I_FatalError("Link Shader \'%s\':\n%s\n",name,local_30._0_8_);
    FString::~FString((FString *)&local_30);
  }
  return;
}

Assistant:

void FShaderProgram::Link(const char *name)
{
	FGLDebug::LabelObject(GL_PROGRAM, mProgram, name);
	glLinkProgram(mProgram);

	GLint status = 0;
	glGetProgramiv(mProgram, GL_LINK_STATUS, &status);
	if (status == GL_FALSE)
	{
		I_FatalError("Link Shader '%s':\n%s\n", name, GetProgramInfoLog(mProgram).GetChars());
	}
}